

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall
slang::parsing::Lexer::scanEncodedText
          (Lexer *this,ProtectEncoding encoding,uint32_t expectedBytes,bool singleLine,
          bool legacyProtectedMode)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  Diagnostic *this_00;
  long lVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  byte invalidChar;
  undefined3 in_register_00000081;
  uint uVar8;
  byte *pbVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  string_view name;
  anon_class_24_3_ac0d555d invalidByte;
  anon_class_16_2_98147aed lookingAtPragma;
  bool local_86;
  bool local_85;
  uint local_84;
  ProtectEncoding local_80;
  uint32_t local_7c;
  ulong local_78;
  uint local_6c;
  byte *local_68;
  anon_class_24_3_ac0d555d local_60;
  ulong local_48;
  anon_class_16_2_98147aed local_40;
  
  local_60.singleLine = &local_85;
  local_40.legacyProtectedMode = &local_86;
  local_60.lookingAtPragma = &local_40;
  uVar8 = (uint)(encoding == QuotedPrintable);
  pbVar9 = (byte *)(this->sourceEnd + -1);
  bVar13 = expectedBytes == 0;
  local_6c = expectedBytes - 1;
  pcVar11 = "pragma";
  bVar14 = CONCAT31(in_register_00000081,legacyProtectedMode) != 0;
  if (bVar14) {
    pcVar11 = "endprotected";
  }
  lVar12 = 5;
  if (bVar14) {
    lVar12 = 0xb;
  }
  uVar10 = 0;
  local_48 = (ulong)encoding;
  pbVar5 = (byte *)this->sourceBuffer;
  local_86 = legacyProtectedMode;
  local_85 = singleLine;
  local_60.this = this;
  local_40.this = this;
  do {
    invalidChar = *pbVar5;
    if ((invalidChar == 0xd) || (invalidChar == 10)) {
      if (singleLine) {
        if (expectedBytes == 0) {
          return;
        }
        if (uVar10 == expectedBytes) {
          return;
        }
        pbVar5 = pbVar5 + ~(ulong)this->originalBegin;
        goto LAB_002ec857;
      }
      pbVar7 = pbVar5 + 1;
      this->sourceBuffer = (char *)pbVar7;
      if (invalidChar == 0xd) {
        lVar4 = 1;
        if (*pbVar7 == 10) {
          pbVar7 = pbVar5 + 2;
          this->sourceBuffer = (char *)pbVar7;
          lVar4 = 2;
        }
        if (encoding == QuotedPrintable) {
          uVar10 = uVar10 + (pbVar5[lVar4 + -1] == 10) + 1;
        }
      }
      else {
        uVar10 = uVar10 + uVar8;
      }
    }
    else {
      if (invalidChar == 0x60 && (bVar13 && !singleLine)) {
        lVar4 = 0;
        do {
          pbVar7 = (byte *)(pcVar11 + lVar4);
          lVar1 = lVar4 + 1;
          if (pbVar5[lVar1] != *pbVar7) break;
          bVar14 = lVar12 != lVar4;
          lVar4 = lVar4 + 1;
        } while (bVar14);
        if (pbVar5[lVar1] == *pbVar7) {
          return;
        }
      }
      pbVar7 = pbVar5;
      if (encoding < 4) {
        switch((long)&switchD_002ec60e::switchdataD_00479a7c +
               (long)(int)(&switchD_002ec60e::switchdataD_00479a7c)[local_48]) {
        case 0x2ec610:
          if (invalidChar == 0x60) {
            pbVar7 = pbVar5 + 1;
LAB_002ec61c:
            this->sourceBuffer = (char *)pbVar7;
          }
          else {
            if ((byte)(invalidChar + 0xb2) < 0xd2) {
LAB_002ec8bb:
              pcVar11 = "uuencode";
              sVar6 = 8;
              goto LAB_002ec8cf;
            }
            uVar2 = invalidChar - 0x20 & 0xff;
            uVar10 = uVar10 + uVar2;
            pbVar7 = pbVar5 + 1;
            this->sourceBuffer = (char *)pbVar7;
            local_84 = uVar8;
            local_80 = encoding;
            local_7c = expectedBytes;
            local_68 = pbVar9;
            dVar15 = ceil((double)(uVar2 << 2) / 3.0);
            uVar3 = (ulong)dVar15;
            uVar2 = (uint)uVar3;
            while (pbVar9 = local_68, expectedBytes = local_7c, encoding = local_80,
                  uVar8 = local_84, uVar2 != 0) {
              invalidChar = *pbVar7;
              if ((byte)(invalidChar + 0x9f) < 0xbf) goto LAB_002ec8bb;
              pbVar7 = pbVar7 + 1;
              this->sourceBuffer = (char *)pbVar7;
              uVar2 = (int)uVar3 - 1;
              uVar3 = (ulong)uVar2;
            }
          }
          break;
        case 0x2ec62a:
          if (invalidChar != 9 && 0x5e < (byte)(invalidChar - 0x20)) {
LAB_002ec8e3:
            pcVar11 = "quoted-printable";
            sVar6 = 0x10;
LAB_002ec8cf:
            name._M_str = pcVar11;
            name._M_len = sVar6;
            scanEncodedText::anon_class_24_3_ac0d555d::operator()(&local_60,invalidChar,name);
            return;
          }
          pbVar7 = pbVar5 + 1;
          this->sourceBuffer = (char *)pbVar7;
          if (invalidChar == 0x3d) {
            invalidChar = *pbVar7;
            if ((invalidChar == 0xd) || (invalidChar == 10)) {
              pbVar7 = pbVar5 + 2;
              this->sourceBuffer = (char *)pbVar7;
              if ((invalidChar == 0xd) && (*pbVar7 == 10)) {
                pbVar7 = pbVar5 + 3;
                goto LAB_002ec61c;
              }
              break;
            }
            if (((9 < (byte)(invalidChar - 0x30)) &&
                ((0x25 < invalidChar - 0x41 ||
                 ((0x3f0000003fU >> ((ulong)(invalidChar - 0x41) & 0x3f) & 1) == 0)))) ||
               ((9 < (byte)(pbVar5[2] - 0x30) &&
                ((uVar2 = pbVar5[2] - 0x41, 0x25 < uVar2 ||
                 ((0x3f0000003fU >> ((ulong)uVar2 & 0x3f) & 1) == 0)))))) goto LAB_002ec8e3;
            pbVar7 = pbVar5 + 3;
            this->sourceBuffer = (char *)pbVar7;
          }
          uVar10 = uVar10 + 1;
          break;
        case 0x2ec682:
          if ((invalidChar == 0) && (pbVar9 <= pbVar5)) {
            Diagnostics::add(this->diagnostics,(DiagCode)0x170002,
                             (SourceLocation)
                             ((long)(pbVar5 + ~(ulong)this->originalBegin) * 0x10000000 |
                             (ulong)((this->bufferId).id & 0xfffffff)));
            return;
          }
          pbVar7 = pbVar5 + 1;
          this->sourceBuffer = (char *)pbVar7;
          uVar10 = uVar10 + 1;
          break;
        case 0x2ec6a1:
          uVar10 = uVar10 + 3;
          uVar2 = 0;
          do {
            invalidChar = *pbVar5;
            if ((uVar2 < 2) || (invalidChar != 0x3d)) {
              if ((0x19 < (byte)(invalidChar + 0x9f) && 9 < (byte)(invalidChar - 0x30)) &&
                 ((invalidChar & 0xfb) != 0x2b && 0x19 < (byte)(invalidChar + 0xbf))) {
                pcVar11 = "base64";
                sVar6 = 6;
                goto LAB_002ec8cf;
              }
            }
            else {
              uVar10 = uVar10 - 1;
            }
            pbVar5 = pbVar5 + 1;
            this->sourceBuffer = (char *)pbVar5;
            uVar2 = uVar2 + 1;
            pbVar7 = pbVar5;
          } while (uVar2 != 4);
        }
      }
    }
    pbVar5 = pbVar7;
  } while (uVar10 <= local_6c || singleLine);
  if (uVar10 != expectedBytes) {
    pbVar5 = (byte *)(this->sourceBuffer + ~(ulong)this->originalBegin);
LAB_002ec857:
    this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0x160002,
                               (SourceLocation)
                               ((long)pbVar5 << 0x1c | (ulong)((this->bufferId).id & 0xfffffff)));
    local_78 = (ulong)uVar10;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&this_00->args,&local_78);
    local_78 = (ulong)expectedBytes;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&this_00->args,&local_78);
  }
  return;
}

Assistant:

void Lexer::scanEncodedText(ProtectEncoding encoding, uint32_t expectedBytes, bool singleLine,
                            bool legacyProtectedMode) {
    // Helper function that returns true if the current position in the buffer
    // is looking at the string "pragma".
    auto lookingAtPragma = [&] {
        int index = 0;
        auto endStr = legacyProtectedMode ? "endprotected"sv : "pragma"sv;
        for (char c : endStr) {
            if (peek(++index) != c)
                return false;
        }
        return true;
    };

    auto invalidByte = [&](char invalidChar, std::string_view name) {
        auto& diag = addDiag(diag::InvalidEncodingByte, currentOffset()) << name;
        diag << (isPrintableASCII(invalidChar) ? std::string(1, invalidChar)
                                               : fmt::format("{:#04x}", invalidChar));

        // Try to skip ahead to the next `pragma directive to get us out of this region.
        while (true) {
            char c = peek();
            if (c == '\0' && reallyAtEnd())
                break;

            if (c == '`' && lookingAtPragma())
                break;

            if (singleLine && (c == '\r' || c == '\n'))
                break;

            advance();
        }
    };

    uint32_t byteCount = 0;
    while (true) {
        if (expectedBytes && byteCount >= expectedBytes && !singleLine) {
            if (byteCount != expectedBytes) {
                addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                    << byteCount << expectedBytes;
            }
            return;
        }

        char c = peek();
        if (c == '\r' || c == '\n') {
            // If this is a single line region then we're done here.
            if (singleLine) {
                if (expectedBytes && byteCount != expectedBytes) {
                    addDiag(diag::ProtectEncodingBytes, currentOffset() - 1)
                        << byteCount << expectedBytes;
                }
                return;
            }

            // Otherwise continue on. This newline doesn't count toward our expected byte limit,
            // unless this is the quoted printable encoding.
            advance();
            if (c == '\r' && peek() == '\n')
                advance();

            if (encoding == ProtectEncoding::QuotedPrintable) {
                byteCount++;
                if (c == '\r' && peek(-1) == '\n')
                    byteCount++;
            }

            continue;
        }

        if (!expectedBytes && !singleLine && c == '`') {
            // Encoding tools probably shouldn't do this but if they do we
            // should try to gracefully guess the end of the region by looking
            // for another non-encoded pragma that ends it.
            if (lookingAtPragma())
                return;
        }

        switch (encoding) {
            case ProtectEncoding::UUEncode: {
                // uuencode tells us the length of the line up front, so use that
                // to read the whole line in one go. The encoding is invalid if that
                // doesn't match up with what we find in the data.
                if (c == '`') {
                    // The grave character is a special case meaning 0 characters on this line.
                    advance();
                    continue;
                }

                if (c < 0x20 || c > 0x20 + 45) {
                    invalidByte(c, "uuencode"sv);
                    return;
                }

                uint32_t count = uint32_t(c - 0x20);
                byteCount += count;
                advance();

                uint32_t encodedCount = (uint32_t)ceil(count * 4 / 3.0);
                for (uint32_t i = 0; i < encodedCount; i++) {
                    c = peek();
                    if (c < 0x20 || c > 0x60) {
                        invalidByte(c, "uuencode"sv);
                        return;
                    }
                    advance();
                }
                break;
            }
            case ProtectEncoding::Base64:
                byteCount += 3;
                for (int i = 0; i < 4; i++) {
                    c = peek();
                    if (i > 1 && c == '=') {
                        byteCount--;
                    }
                    else if (!isBase64Char(c)) {
                        invalidByte(c, "base64"sv);
                        return;
                    }

                    advance();
                }
                break;
            case ProtectEncoding::QuotedPrintable:
                if (!isPrintableASCII(c) && c != '\t') {
                    invalidByte(c, "quoted-printable"sv);
                    return;
                }

                advance();
                if (c == '=') {
                    // If this is a soft line break then it doesn't count
                    // towards our byte count. Otherwise this is an escaped
                    // character that does count.
                    c = peek();
                    if (c == '\r' || c == '\n') {
                        advance();
                        if (c == '\r' && peek() == '\n')
                            advance();
                        continue;
                    }

                    if (!isHexDigit(c) || !isHexDigit(peek(1))) {
                        invalidByte(c, "quoted-printable"sv);
                        return;
                    }

                    advance(2);
                }
                byteCount++;
                break;
            case ProtectEncoding::Raw:
                if (c == '\0' && reallyAtEnd()) {
                    addDiag(diag::RawProtectEOF, currentOffset() - 1);
                    return;
                }

                advance();
                byteCount++;
                break;
        }
    }
}